

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangle.cpp
# Opt level: O2

ChTriangle * __thiscall chrono::geometry::ChTriangle::operator=(ChTriangle *this,ChTriangle *source)

{
  if (source != this) {
    (this->p1).m_data[0] = (source->p1).m_data[0];
    (this->p1).m_data[1] = (source->p1).m_data[1];
    (this->p1).m_data[2] = (source->p1).m_data[2];
    (this->p2).m_data[0] = (source->p2).m_data[0];
    (this->p2).m_data[1] = (source->p2).m_data[1];
    (this->p2).m_data[2] = (source->p2).m_data[2];
    (this->p3).m_data[0] = (source->p3).m_data[0];
    (this->p3).m_data[1] = (source->p3).m_data[1];
    (this->p3).m_data[2] = (source->p3).m_data[2];
  }
  return this;
}

Assistant:

ChTriangle& ChTriangle::operator=(const ChTriangle& source) {
    if (&source == this)
        return *this;
    p1 = source.p1;
    p2 = source.p2;
    p3 = source.p3;
    return *this;
}